

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_barrier_test.cc
# Opt level: O1

void __thiscall
disruptor::test::SequenceBarrier::BasicSetterAndGetter::test_method(BasicSetterAndGetter *this)

{
  undefined1 local_10a;
  byte local_109;
  undefined1 *local_108;
  byte *local_100;
  byte local_f8 [8];
  undefined8 local_f0;
  shared_count sStack_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined8 *local_d0;
  undefined1 **local_c8;
  undefined **local_c0;
  undefined1 local_b8;
  undefined8 *local_b0;
  byte **local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined8 *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x3a);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_00109b98;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_109 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).barrier.alerted_._M_base._M_i & 1;
  local_100 = &local_109;
  local_108 = &local_10a;
  local_10a = 0;
  local_f8[0] = local_109 ^ 1;
  local_f0 = 0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_98 = "";
  local_a8 = &local_100;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_00109c10;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = 0;
  local_c8 = &local_108;
  local_e0 = &PTR__lazy_ostream_00109c10;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_e8);
  (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).barrier.alerted_._M_base._M_i = true;
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x3c);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_00109b98;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_109 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).barrier.alerted_._M_base._M_i & 1;
  local_10a = 1;
  local_f0 = 0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_98 = "";
  local_100 = &local_109;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_00109c10;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_100;
  local_108 = &local_10a;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_00109c10;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_108;
  local_f8[0] = local_109;
  boost::test_tools::tt_detail::report_assertion
            (local_f8,&local_70,&local_a0,0x3c,1,2,2,"barrier.alerted()",&local_c0,"true",&local_e0)
  ;
  boost::detail::shared_count::~shared_count(&sStack_e8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(BasicSetterAndGetter) {
  BOOST_CHECK_EQUAL(barrier.alerted(), false);
  barrier.set_alerted(true);
  BOOST_CHECK_EQUAL(barrier.alerted(), true);
}